

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

RESULT_TYPE_conflict1 __thiscall
duckdb::Interpolator<true>::InterpolateInternal<int,duckdb::QuantileDirect<int>>
          (Interpolator<true> *this,int *v_t,QuantileDirect<int> *accessor)

{
  INPUT_TYPE_conflict1 *pIVar1;
  QuantileDirect<int> *in_RDX;
  long in_RSI;
  byte *in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int *in_stack_00000010;
  QuantileCompare<duckdb::QuantileDirect<int>_> in_stack_00000020;
  QuantileCompare<duckdb::QuantileDirect<int>_> comp;
  QuantileCompare<duckdb::QuantileDirect<int>_> local_30;
  QuantileDirect<int> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  QuantileCompare<duckdb::QuantileDirect<int>_>::QuantileCompare
            (&local_30,in_RDX,(bool)(*in_RDI & 1));
  std::nth_element<int*,duckdb::QuantileCompare<duckdb::QuantileDirect<int>>>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000020);
  pIVar1 = QuantileDirect<int>::operator()
                     (local_18,(INPUT_TYPE_conflict1 *)(local_10 + *(long *)(in_RDI + 8) * 4));
  return *pIVar1;
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}